

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceGroup * __thiscall
cmMakefile::GetSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  string *psVar3;
  pointer pbVar4;
  cmSourceGroup *this_00;
  uint uVar5;
  ulong uVar6;
  cmSourceGroup *srcGroup;
  pointer this_01;
  bool bVar7;
  
  pcVar1 = (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->SourceGroups).
                 super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 = (cmSourceGroup *)0x0, this_01 != pcVar1
      ; this_01 = this_01 + 1) {
    psVar3 = cmSourceGroup::GetName_abi_cxx11_(this_01);
    pbVar4 = (name->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __n = psVar3->_M_string_length;
    if (__n == pbVar4->_M_string_length) {
      if (__n == 0) {
        bVar7 = true;
      }
      else {
        iVar2 = bcmp((psVar3->_M_dataplus)._M_p,(pbVar4->_M_dataplus)._M_p,__n);
        bVar7 = iVar2 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    this_00 = this_01;
    if (bVar7) break;
  }
  if (this_00 == (cmSourceGroup *)0x0) {
LAB_00183d19:
    this_00 = (cmSourceGroup *)0x0;
  }
  else {
    pbVar4 = (name->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (0x20 < (ulong)((long)(name->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4)) {
      uVar6 = 1;
      uVar5 = 2;
      do {
        this_00 = cmSourceGroup::LookupChild(this_00,pbVar4 + uVar6);
        if (this_00 == (cmSourceGroup *)0x0) goto LAB_00183d19;
        uVar6 = (ulong)uVar5;
        pbVar4 = (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar5 = uVar5 + 1;
      } while (uVar6 < (ulong)((long)(name->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5
                              ));
    }
  }
  return this_00;
}

Assistant:

cmSourceGroup* cmMakefile::GetSourceGroup(
  const std::vector<std::string>& name) const
{
  cmSourceGroup* sg = nullptr;

  // first look for source group starting with the same as the one we want
  for (cmSourceGroup const& srcGroup : this->SourceGroups) {
    std::string const& sgName = srcGroup.GetName();
    if (sgName == name[0]) {
      sg = const_cast<cmSourceGroup*>(&srcGroup);
      break;
    }
  }

  if (sg != nullptr) {
    // iterate through its children to find match source group
    for (unsigned int i = 1; i < name.size(); ++i) {
      sg = sg->LookupChild(name[i]);
      if (sg == nullptr) {
        break;
      }
    }
  }
  return sg;
}